

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

value * __thiscall
mjs::object::property::get(value *__return_storage_ptr__,property *this,object *self)

{
  gc_heap *heap;
  bool bVar1;
  undefined8 *puVar2;
  byte bVar3;
  object_ptr a;
  value v;
  value g;
  gc_heap_ptr_untyped local_e8;
  undefined1 local_d8 [8];
  anon_union_32_5_7b1e0779_for_value_3 local_d0;
  undefined1 local_b0 [24];
  gc_heap *local_98;
  uint32_t local_90;
  vector<mjs::value,_std::allocator<mjs::value>_> local_78;
  value local_58;
  
  heap = self->heap_;
  value_representation::get_value((value *)(local_b0 + 0x10),&this->value_,heap);
  bVar1 = has_attributes(this->attributes_,accessor);
  if (bVar1) {
    if (local_b0._16_4_ != 5) {
      __assert_fail("v.type() == value_type::object",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object.cpp"
                    ,0xe2,"value mjs::object::property::get(const object &) const");
    }
    local_e8.heap_ = local_98;
    local_e8.pos_ = local_90;
    if (local_98 != (gc_heap *)0x0) {
      gc_heap::attach(local_98,&local_e8);
    }
    puVar2 = (undefined8 *)gc_heap_ptr_untyped::get(&local_e8);
    local_d8 = (undefined1  [8])0x3;
    local_d0.n_ = 1.06965805203405e-317;
    (**(code **)*puVar2)(&local_58,puVar2);
    puVar2 = (undefined8 *)gc_heap_ptr_untyped::get(&local_e8);
    local_78.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xa;
    local_78.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x210958;
    (**(code **)*puVar2)(local_d8,puVar2);
    if (local_d8._0_4_ != boolean) {
      __assert_fail("type_ == value_type::boolean",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h",
                    0x43,"bool mjs::value::boolean_value() const");
    }
    if (local_d0.b_ == true) {
      bVar1 = is_primitive_object(self);
    }
    else {
      bVar1 = false;
    }
    value::destroy((value *)local_d8);
    if (local_58.type_ == undefined) {
      bVar3 = 0;
      value::value(__return_storage_ptr__,&local_58);
    }
    else {
      if (bVar1 == false) {
        gc_heap::unsafe_track<mjs::object>((gc_heap *)local_b0,(object *)heap);
        local_d8._0_4_ = object;
        local_d0.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
             (gc_heap *)local_b0._0_8_;
        local_d0.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ =
             local_b0._8_4_;
        if ((gc_heap *)local_b0._0_8_ != (gc_heap *)0x0) {
          gc_heap::attach((gc_heap *)local_b0._0_8_,(gc_heap_ptr_untyped *)&local_d0.s_);
        }
      }
      else {
        (*self->_vptr_object[4])(local_d8,self);
      }
      bVar3 = bVar1 ^ 1;
      local_78.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.super__Vector_base<mjs::value,_std::allocator<mjs::value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      call_function(__return_storage_ptr__,&local_58,(value *)local_d8,&local_78);
    }
    if (local_58.type_ != undefined) {
      std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&local_78);
      value::destroy((value *)local_d8);
    }
    if (bVar3 != 0) {
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_b0);
    }
    value::destroy(&local_58);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e8);
  }
  else {
    value::value(__return_storage_ptr__,(value *)(local_b0 + 0x10));
  }
  value::destroy((value *)(local_b0 + 0x10));
  return __return_storage_ptr__;
}

Assistant:

value object::property::get(const object& self) const {
    auto& h = self.heap();
    auto v = raw_get(h);
    if (is_accessor()) {
        assert(v.type() == value_type::object);
        auto a = v.object_value();
        auto g = a->get(L"get");
        const bool strict = a->get(L"__strict__").boolean_value() && is_primitive_object(self);
        return g.type() != value_type::undefined ? call_function(g, strict ? self.internal_value() : value{h.unsafe_track(self)}, {}) : g;
    }
    return v;
}